

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

pair<float,_float> * calloc_or_throw<std::pair<float,float>>(size_t nmemb)

{
  pair<float,_float> *ppVar1;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (nmemb == 0) {
    ppVar1 = (pair<float,_float> *)0x0;
  }
  else {
    ppVar1 = (pair<float,_float> *)calloc(nmemb,8);
    if (ppVar1 == (pair<float,_float> *)0x0) {
      fputs("internal error: memory allocation failed!\n",_stderr);
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"internal error: memory allocation failed!\n");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/memory.h"
                 ,0x14,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return ppVar1;
}

Assistant:

T* calloc_or_throw(size_t nmemb)
{
  if (nmemb == 0)
    return nullptr;

  void* data = calloc(nmemb, sizeof(T));
  if (data == nullptr)
  {
    const char* msg = "internal error: memory allocation failed!\n";
    // use low-level function since we're already out of memory.
    fputs(msg, stderr);
    THROW(msg);
  }
  return (T*)data;
}